

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O2

void __thiscall CgroupController::close_enter_fd(CgroupController *this)

{
  int iVar1;
  ContextManager *pCVar2;
  string sStack_38;
  
  iVar1 = close(this->enter_fd_);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&sStack_38,"Cannot close cgroups tasks file: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  this->enter_fd_ = -1;
  return;
}

Assistant:

void CgroupController::close_enter_fd() {
    if (close(enter_fd_) != 0) {
        die(format("Cannot close cgroups tasks file: %m"));
    }
    enter_fd_ = -1;
}